

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O2

void __thiscall state_t::state_t(state_t *this,size_t width,size_t height,tiles_t *tiles)

{
  _Rb_tree_header *p_Var1;
  __node_base *p_Var2;
  allocator_type local_42;
  allocator_type local_41;
  _Vector_base<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
  local_40;
  
  std::
  vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
  ::vector((vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
            *)&local_40,width,&local_41);
  std::
  vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ::vector(&this->image,height,(value_type *)&local_40,&local_42);
  std::
  _Vector_base<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
  ::~_Vector_base(&local_40);
  (this->available)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->available)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->available)._M_t._M_impl.super__Rb_tree_header;
  (this->available)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->available)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->col = 0;
  (this->available)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->row = 0;
  this->w = width;
  this->h = height;
  p_Var2 = &(tiles->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&this->available,(unsigned_long *)(p_Var2 + 1));
  }
  return;
}

Assistant:

state_t(size_t width, size_t height, const tiles_t& tiles)
      : w{width}, h{height}, image(height, image_t::value_type(width))
  {
    for (const auto& t : tiles) {
      available.insert(t.first);
    }
  }